

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Options::TagOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,TagOptionParser *this)

{
  allocator<char> local_19;
  TagOptionParser *local_18;
  TagOptionParser *this_local;
  
  local_18 = this;
  this_local = (TagOptionParser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "This option allows one or more tags or tag patterns to be specified.\nEach tag is enclosed in square brackets. A series of tags form an AND expression wheras a comma seperated sequence forms an OR expression. e.g.:\n\n    -g [one][two],[three]\n\nThis matches all tests tagged [one] and [two], as well as all tests tagged [three].\n\nTags can be negated with the ~ character. This removes matching tests from the set. e.g.:\n\n    -g [one]~[two]\n\nmatches all tests tagged [one], except those also tagged [two]"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                "This option allows one or more tags or tag patterns to be specified.\n"
                "Each tag is enclosed in square brackets. A series of tags form an AND expression "
                "wheras a comma seperated sequence forms an OR expression. e.g.:\n\n"
                "    -g [one][two],[three]\n\n"
                "This matches all tests tagged [one] and [two], as well as all tests tagged [three].\n\n"
                "Tags can be negated with the ~ character. This removes matching tests from the set. e.g.:\n\n"
                "    -g [one]~[two]\n\n"
                "matches all tests tagged [one], except those also tagged [two]";
            }